

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O1

void iadst16_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  longlong local_178;
  longlong lStack_170;
  longlong lStack_168;
  longlong lStack_160;
  longlong local_f8;
  longlong lStack_f0;
  longlong lStack_e8;
  longlong lStack_e0;
  
  lVar11 = (long)bit * 0x100;
  iVar12 = 1 << ((char)bit - 1U & 0x1f);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x168);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar45._16_4_ = uVar1;
  auVar45._20_4_ = uVar1;
  auVar45._24_4_ = uVar1;
  auVar45._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 600);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar47._16_4_ = uVar1;
  auVar47._20_4_ = uVar1;
  auVar47._24_4_ = uVar1;
  auVar47._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x188);
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34._16_4_ = uVar1;
  auVar34._20_4_ = uVar1;
  auVar34._24_4_ = uVar1;
  auVar34._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x238);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar41._16_4_ = uVar1;
  auVar41._20_4_ = uVar1;
  auVar41._24_4_ = uVar1;
  auVar41._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1a8);
  auVar29._4_4_ = uVar1;
  auVar29._0_4_ = uVar1;
  auVar29._8_4_ = uVar1;
  auVar29._12_4_ = uVar1;
  auVar29._16_4_ = uVar1;
  auVar29._20_4_ = uVar1;
  auVar29._24_4_ = uVar1;
  auVar29._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x218);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar22._16_4_ = uVar1;
  auVar22._20_4_ = uVar1;
  auVar22._24_4_ = uVar1;
  auVar22._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1c8);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1f8);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  auVar27._16_4_ = uVar1;
  auVar27._20_4_ = uVar1;
  auVar27._24_4_ = uVar1;
  auVar27._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1e8);
  auVar44._4_4_ = uVar1;
  auVar44._0_4_ = uVar1;
  auVar44._8_4_ = uVar1;
  auVar44._12_4_ = uVar1;
  auVar44._16_4_ = uVar1;
  auVar44._20_4_ = uVar1;
  auVar44._24_4_ = uVar1;
  auVar44._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1d8);
  auVar43._4_4_ = uVar1;
  auVar43._0_4_ = uVar1;
  auVar43._8_4_ = uVar1;
  auVar43._12_4_ = uVar1;
  auVar43._16_4_ = uVar1;
  auVar43._20_4_ = uVar1;
  auVar43._24_4_ = uVar1;
  auVar43._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x208);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar38._16_4_ = uVar1;
  auVar38._20_4_ = uVar1;
  auVar38._24_4_ = uVar1;
  auVar38._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1b8);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  auVar48._16_4_ = uVar1;
  auVar48._20_4_ = uVar1;
  auVar48._24_4_ = uVar1;
  auVar48._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x228);
  auVar33._4_4_ = uVar1;
  auVar33._0_4_ = uVar1;
  auVar33._8_4_ = uVar1;
  auVar33._12_4_ = uVar1;
  auVar33._16_4_ = uVar1;
  auVar33._20_4_ = uVar1;
  auVar33._24_4_ = uVar1;
  auVar33._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x198);
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar21._16_4_ = uVar1;
  auVar21._20_4_ = uVar1;
  auVar21._24_4_ = uVar1;
  auVar21._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x248);
  auVar17._4_4_ = uVar1;
  auVar17._0_4_ = uVar1;
  auVar17._8_4_ = uVar1;
  auVar17._12_4_ = uVar1;
  auVar17._16_4_ = uVar1;
  auVar17._20_4_ = uVar1;
  auVar17._24_4_ = uVar1;
  auVar17._28_4_ = uVar1;
  auVar47 = vpmulld_avx2((undefined1  [32])*in,auVar47);
  auVar45 = vpmulld_avx2((undefined1  [32])*in,auVar45);
  auVar41 = vpmulld_avx2((undefined1  [32])in[2],auVar41);
  auVar34 = vpmulld_avx2((undefined1  [32])in[2],auVar34);
  auVar22 = vpmulld_avx2((undefined1  [32])in[4],auVar22);
  auVar29 = vpmulld_avx2((undefined1  [32])in[4],auVar29);
  auVar27 = vpmulld_avx2((undefined1  [32])in[6],auVar27);
  auVar23 = vpmulld_avx2((undefined1  [32])in[6],auVar23);
  auVar44 = vpmulld_avx2((undefined1  [32])in[7],auVar44);
  auVar43 = vpmulld_avx2((undefined1  [32])in[7],auVar43);
  auVar38 = vpmulld_avx2((undefined1  [32])in[5],auVar38);
  auVar48 = vpmulld_avx2((undefined1  [32])in[5],auVar48);
  auVar33 = vpmulld_avx2((undefined1  [32])in[3],auVar33);
  auVar21 = vpmulld_avx2((undefined1  [32])in[3],auVar21);
  auVar17 = vpmulld_avx2((undefined1  [32])in[1],auVar17);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x178);
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar18._16_4_ = uVar1;
  auVar18._20_4_ = uVar1;
  auVar18._24_4_ = uVar1;
  auVar18._28_4_ = uVar1;
  auVar18 = vpmulld_avx2((undefined1  [32])in[1],auVar18);
  auVar49._4_4_ = iVar12;
  auVar49._0_4_ = iVar12;
  auVar49._8_4_ = iVar12;
  auVar49._12_4_ = iVar12;
  auVar49._16_4_ = iVar12;
  auVar49._20_4_ = iVar12;
  auVar49._24_4_ = iVar12;
  auVar49._28_4_ = iVar12;
  auVar47 = vpaddd_avx2(auVar47,auVar49);
  auVar25 = vpsrad_avx2(auVar47,ZEXT416((uint)bit));
  auVar47 = vpaddd_avx2(auVar49,auVar44);
  auVar44 = vpsrad_avx2(auVar47,ZEXT416((uint)bit));
  auVar47 = vpaddd_avx2(auVar25,auVar44);
  auVar25 = vpsubd_avx2(auVar25,auVar44);
  auVar45 = vpsubd_avx2(auVar49,auVar45);
  auVar20 = ZEXT416((uint)bit);
  auVar44 = vpsrad_avx2(auVar45,auVar20);
  auVar45 = vpaddd_avx2(auVar43,auVar49);
  auVar43 = vpsrad_avx2(auVar45,auVar20);
  auVar45 = vpaddd_avx2(auVar43,auVar44);
  auVar30 = vpsubd_avx2(auVar44,auVar43);
  auVar41 = vpaddd_avx2(auVar41,auVar49);
  auVar44 = vpsrad_avx2(auVar41,auVar20);
  auVar41 = vpaddd_avx2(auVar38,auVar49);
  auVar43 = vpsrad_avx2(auVar41,auVar20);
  auVar41 = vpaddd_avx2(auVar43,auVar44);
  auVar38 = vpsubd_avx2(auVar44,auVar43);
  auVar34 = vpsubd_avx2(auVar49,auVar34);
  auVar20 = ZEXT416((uint)bit);
  auVar44 = vpsrad_avx2(auVar34,auVar20);
  auVar34 = vpaddd_avx2(auVar49,auVar48);
  auVar43 = vpsrad_avx2(auVar34,auVar20);
  auVar34 = vpaddd_avx2(auVar43,auVar44);
  auVar48 = vpsubd_avx2(auVar44,auVar43);
  auVar22 = vpaddd_avx2(auVar49,auVar22);
  auVar44 = vpsrad_avx2(auVar22,auVar20);
  auVar22 = vpaddd_avx2(auVar33,auVar49);
  auVar43 = vpsrad_avx2(auVar22,auVar20);
  auVar22 = vpaddd_avx2(auVar43,auVar44);
  auVar33 = vpsubd_avx2(auVar44,auVar43);
  auVar29 = vpsubd_avx2(auVar49,auVar29);
  auVar44 = vpsrad_avx2(auVar29,auVar20);
  auVar29 = vpaddd_avx2(auVar49,auVar21);
  auVar43 = vpsrad_avx2(auVar29,auVar20);
  auVar29 = vpaddd_avx2(auVar43,auVar44);
  auVar21 = vpsubd_avx2(auVar44,auVar43);
  auVar27 = vpaddd_avx2(auVar49,auVar27);
  auVar44 = vpsrad_avx2(auVar27,auVar20);
  auVar27 = vpaddd_avx2(auVar49,auVar17);
  auVar43 = vpsrad_avx2(auVar27,auVar20);
  auVar27 = vpaddd_avx2(auVar43,auVar44);
  auVar17 = vpsubd_avx2(auVar44,auVar43);
  auVar23 = vpsubd_avx2(auVar49,auVar23);
  auVar20 = ZEXT416((uint)bit);
  auVar44 = vpsrad_avx2(auVar23,auVar20);
  auVar23 = vpaddd_avx2(auVar18,auVar49);
  auVar43 = vpsrad_avx2(auVar23,auVar20);
  auVar23 = vpaddd_avx2(auVar43,auVar44);
  auVar44 = vpsubd_avx2(auVar44,auVar43);
  iVar12 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x240);
  iVar14 = -iVar12;
  iVar10 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x1c0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar11 + 0x220);
  iVar13 = -iVar10;
  iVar15 = -iVar2;
  iVar16 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar9 = 0x8000;
  if (0xf < iVar16) {
    iVar9 = 1 << ((char)iVar16 - 1U & 0x1f);
  }
  iVar16 = -iVar9;
  iVar9 = iVar9 + -1;
  auVar42._4_4_ = iVar12;
  auVar42._0_4_ = iVar12;
  auVar42._8_4_ = iVar12;
  auVar42._12_4_ = iVar12;
  auVar42._16_4_ = iVar12;
  auVar42._20_4_ = iVar12;
  auVar42._24_4_ = iVar12;
  auVar42._28_4_ = iVar12;
  auVar28._4_4_ = iVar16;
  auVar28._0_4_ = iVar16;
  auVar28._8_4_ = iVar16;
  auVar28._12_4_ = iVar16;
  auVar28._16_4_ = iVar16;
  auVar28._20_4_ = iVar16;
  auVar28._24_4_ = iVar16;
  auVar28._28_4_ = iVar16;
  auVar24._4_4_ = iVar9;
  auVar24._0_4_ = iVar9;
  auVar24._8_4_ = iVar9;
  auVar24._12_4_ = iVar9;
  auVar24._16_4_ = iVar9;
  auVar24._20_4_ = iVar9;
  auVar24._24_4_ = iVar9;
  auVar24._28_4_ = iVar9;
  auVar43 = vpmaxsd_avx2(auVar25,auVar28);
  auVar18 = vpminsd_avx2(auVar43,auVar24);
  auVar43 = vpmaxsd_avx2(auVar30,auVar28);
  auVar25 = vpminsd_avx2(auVar43,auVar24);
  auVar30 = vpmulld_avx2(auVar18,auVar42);
  auVar42 = vpmulld_avx2(auVar25,auVar42);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x180);
  auVar37._4_4_ = uVar1;
  auVar37._0_4_ = uVar1;
  auVar37._8_4_ = uVar1;
  auVar37._12_4_ = uVar1;
  auVar37._16_4_ = uVar1;
  auVar37._20_4_ = uVar1;
  auVar37._24_4_ = uVar1;
  auVar37._28_4_ = uVar1;
  auVar43 = vpmulld_avx2(auVar18,auVar37);
  auVar43 = vpaddd_avx2(auVar43,auVar49);
  auVar43 = vpaddd_avx2(auVar43,auVar42);
  auVar25 = vpmulld_avx2(auVar37,auVar25);
  auVar18 = vpaddd_avx2(auVar49,auVar30);
  auVar42 = vpsubd_avx2(auVar18,auVar25);
  auVar30._4_4_ = iVar10;
  auVar30._0_4_ = iVar10;
  auVar30._8_4_ = iVar10;
  auVar30._12_4_ = iVar10;
  auVar30._16_4_ = iVar10;
  auVar30._20_4_ = iVar10;
  auVar30._24_4_ = iVar10;
  auVar30._28_4_ = iVar10;
  auVar38 = vpmaxsd_avx2(auVar38,auVar28);
  auVar18 = vpminsd_avx2(auVar38,auVar24);
  auVar38 = vpmaxsd_avx2(auVar48,auVar28);
  auVar48 = vpminsd_avx2(auVar38,auVar24);
  auVar25 = vpmulld_avx2(auVar48,auVar30);
  auVar30 = vpmulld_avx2(auVar18,auVar30);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x200);
  auVar31._4_4_ = uVar1;
  auVar31._0_4_ = uVar1;
  auVar31._8_4_ = uVar1;
  auVar31._12_4_ = uVar1;
  auVar31._16_4_ = uVar1;
  auVar31._20_4_ = uVar1;
  auVar31._24_4_ = uVar1;
  auVar31._28_4_ = uVar1;
  auVar38 = vpmulld_avx2(auVar18,auVar31);
  auVar38 = vpaddd_avx2(auVar38,auVar49);
  auVar38 = vpaddd_avx2(auVar38,auVar25);
  auVar18 = vpmulld_avx2(auVar31,auVar48);
  auVar48 = vpaddd_avx2(auVar30,auVar49);
  auVar30 = vpsubd_avx2(auVar48,auVar18);
  auVar35._4_4_ = iVar14;
  auVar35._0_4_ = iVar14;
  auVar35._8_4_ = iVar14;
  auVar35._12_4_ = iVar14;
  auVar35._16_4_ = iVar14;
  auVar35._20_4_ = iVar14;
  auVar35._24_4_ = iVar14;
  auVar35._28_4_ = iVar14;
  auVar48 = vpmaxsd_avx2(auVar33,auVar28);
  auVar33 = vpminsd_avx2(auVar48,auVar24);
  auVar48 = vpmaxsd_avx2(auVar21,auVar28);
  auVar21 = vpminsd_avx2(auVar48,auVar24);
  auVar18 = vpmulld_avx2(auVar21,auVar37);
  auVar25 = vpmulld_avx2(auVar33,auVar37);
  auVar48 = vpmulld_avx2(auVar33,auVar35);
  auVar48 = vpaddd_avx2(auVar48,auVar49);
  auVar48 = vpaddd_avx2(auVar48,auVar18);
  auVar21 = vpmulld_avx2(auVar35,auVar21);
  auVar33 = vpaddd_avx2(auVar25,auVar49);
  auVar25 = vpsubd_avx2(auVar33,auVar21);
  auVar39._4_4_ = iVar13;
  auVar39._0_4_ = iVar13;
  auVar39._8_4_ = iVar13;
  auVar39._12_4_ = iVar13;
  auVar39._16_4_ = iVar13;
  auVar39._20_4_ = iVar13;
  auVar39._24_4_ = iVar13;
  auVar39._28_4_ = iVar13;
  auVar33 = vpmaxsd_avx2(auVar17,auVar28);
  auVar33 = vpminsd_avx2(auVar33,auVar24);
  auVar44 = vpmaxsd_avx2(auVar44,auVar28);
  auVar21 = vpminsd_avx2(auVar44,auVar24);
  auVar17 = vpmulld_avx2(auVar21,auVar31);
  auVar18 = vpmulld_avx2(auVar33,auVar31);
  auVar44 = vpmulld_avx2(auVar33,auVar39);
  auVar44 = vpaddd_avx2(auVar44,auVar49);
  auVar44 = vpaddd_avx2(auVar44,auVar17);
  auVar21 = vpmulld_avx2(auVar39,auVar21);
  auVar33 = vpaddd_avx2(auVar49,auVar18);
  auVar21 = vpsubd_avx2(auVar33,auVar21);
  auVar47 = vpmaxsd_avx2(auVar28,auVar47);
  auVar33 = vpminsd_avx2(auVar47,auVar24);
  auVar47 = vpmaxsd_avx2(auVar28,auVar22);
  auVar22 = vpminsd_avx2(auVar47,auVar24);
  auVar47 = vpaddd_avx2(auVar22,auVar33);
  auVar33 = vpsubd_avx2(auVar33,auVar22);
  auVar45 = vpmaxsd_avx2(auVar28,auVar45);
  auVar22 = vpminsd_avx2(auVar45,auVar24);
  auVar45 = vpmaxsd_avx2(auVar28,auVar29);
  auVar29 = vpminsd_avx2(auVar45,auVar24);
  auVar45 = vpaddd_avx2(auVar29,auVar22);
  auVar17 = vpsubd_avx2(auVar22,auVar29);
  auVar41 = vpmaxsd_avx2(auVar28,auVar41);
  auVar22 = vpminsd_avx2(auVar41,auVar24);
  auVar41 = vpmaxsd_avx2(auVar28,auVar27);
  auVar29 = vpminsd_avx2(auVar41,auVar24);
  auVar41 = vpaddd_avx2(auVar29,auVar22);
  auVar18 = vpsubd_avx2(auVar22,auVar29);
  auVar34 = vpmaxsd_avx2(auVar28,auVar34);
  auVar22 = vpminsd_avx2(auVar34,auVar24);
  auVar34 = vpmaxsd_avx2(auVar28,auVar23);
  auVar29 = vpminsd_avx2(auVar34,auVar24);
  auVar34 = vpaddd_avx2(auVar29,auVar22);
  auVar31 = vpsubd_avx2(auVar22,auVar29);
  auVar29 = vpsrad_avx2(auVar43,auVar20);
  auVar27 = vpsrad_avx2(auVar48,auVar20);
  auVar22 = vpaddd_avx2(auVar29,auVar27);
  auVar35 = vpsubd_avx2(auVar29,auVar27);
  auVar27 = vpsrad_avx2(auVar42,auVar20);
  auVar23 = vpsrad_avx2(auVar25,auVar20);
  auVar29 = vpaddd_avx2(auVar23,auVar27);
  auVar25 = vpsubd_avx2(auVar27,auVar23);
  auVar23 = vpsrad_avx2(auVar38,auVar20);
  auVar44 = vpsrad_avx2(auVar44,auVar20);
  auVar27 = vpaddd_avx2(auVar44,auVar23);
  auVar42 = vpsubd_avx2(auVar23,auVar44);
  auVar44 = vpsrad_avx2(auVar30,auVar20);
  auVar43 = vpsrad_avx2(auVar21,auVar20);
  auVar23 = vpaddd_avx2(auVar43,auVar44);
  auVar30 = vpsubd_avx2(auVar44,auVar43);
  auVar19._4_4_ = iVar2;
  auVar19._0_4_ = iVar2;
  auVar19._8_4_ = iVar2;
  auVar19._12_4_ = iVar2;
  auVar19._16_4_ = iVar2;
  auVar19._20_4_ = iVar2;
  auVar19._24_4_ = iVar2;
  auVar19._28_4_ = iVar2;
  auVar44 = vpmaxsd_avx2(auVar33,auVar28);
  auVar43 = vpminsd_avx2(auVar44,auVar24);
  auVar44 = vpmaxsd_avx2(auVar17,auVar28);
  auVar38 = vpminsd_avx2(auVar44,auVar24);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1a0);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  auVar44 = vpmulld_avx2(auVar43,auVar40);
  auVar44 = vpaddd_avx2(auVar44,auVar49);
  auVar48 = vpmulld_avx2(auVar38,auVar19);
  auVar44 = vpaddd_avx2(auVar44,auVar48);
  auVar43 = vpmulld_avx2(auVar43,auVar19);
  auVar38 = vpmulld_avx2(auVar40,auVar38);
  auVar43 = vpaddd_avx2(auVar49,auVar43);
  auVar37 = vpsubd_avx2(auVar43,auVar38);
  auVar32._4_4_ = iVar15;
  auVar32._0_4_ = iVar15;
  auVar32._8_4_ = iVar15;
  auVar32._12_4_ = iVar15;
  auVar32._16_4_ = iVar15;
  auVar32._20_4_ = iVar15;
  auVar32._24_4_ = iVar15;
  auVar32._28_4_ = iVar15;
  auVar43 = vpmaxsd_avx2(auVar18,auVar28);
  auVar38 = vpminsd_avx2(auVar43,auVar24);
  auVar43 = vpmaxsd_avx2(auVar31,auVar28);
  auVar48 = vpminsd_avx2(auVar43,auVar24);
  auVar43 = vpmulld_avx2(auVar38,auVar32);
  auVar43 = vpaddd_avx2(auVar49,auVar43);
  auVar33 = vpmulld_avx2(auVar48,auVar40);
  auVar43 = vpaddd_avx2(auVar33,auVar43);
  auVar38 = vpmulld_avx2(auVar38,auVar40);
  auVar48 = vpmulld_avx2(auVar32,auVar48);
  auVar38 = vpaddd_avx2(auVar38,auVar49);
  auVar31 = vpsubd_avx2(auVar38,auVar48);
  auVar38 = vpmaxsd_avx2(auVar35,auVar28);
  auVar48 = vpminsd_avx2(auVar38,auVar24);
  auVar38 = vpmaxsd_avx2(auVar25,auVar28);
  auVar33 = vpminsd_avx2(auVar38,auVar24);
  auVar21 = vpmulld_avx2(auVar33,auVar19);
  auVar17 = vpmulld_avx2(auVar48,auVar19);
  auVar38 = vpmulld_avx2(auVar48,auVar40);
  auVar38 = vpaddd_avx2(auVar38,auVar49);
  auVar38 = vpaddd_avx2(auVar38,auVar21);
  auVar33 = vpmulld_avx2(auVar40,auVar33);
  auVar48 = vpaddd_avx2(auVar17,auVar49);
  auVar25 = vpsubd_avx2(auVar48,auVar33);
  auVar48 = vpmaxsd_avx2(auVar42,auVar28);
  auVar33 = vpminsd_avx2(auVar48,auVar24);
  auVar48 = vpmaxsd_avx2(auVar30,auVar28);
  auVar21 = vpminsd_avx2(auVar48,auVar24);
  auVar17 = vpmulld_avx2(auVar21,auVar40);
  auVar18 = vpmulld_avx2(auVar33,auVar40);
  auVar48 = vpmulld_avx2(auVar33,auVar32);
  auVar48 = vpaddd_avx2(auVar49,auVar48);
  auVar48 = vpaddd_avx2(auVar17,auVar48);
  auVar21 = vpmulld_avx2(auVar32,auVar21);
  auVar33 = vpaddd_avx2(auVar18,auVar49);
  auVar21 = vpsubd_avx2(auVar33,auVar21);
  auVar47 = vpmaxsd_avx2(auVar28,auVar47);
  auVar33 = vpminsd_avx2(auVar47,auVar24);
  auVar47 = vpmaxsd_avx2(auVar28,auVar41);
  auVar41 = vpminsd_avx2(auVar47,auVar24);
  auVar47 = vpaddd_avx2(auVar41,auVar33);
  auVar33 = vpsubd_avx2(auVar33,auVar41);
  auVar45 = vpmaxsd_avx2(auVar28,auVar45);
  auVar41 = vpminsd_avx2(auVar45,auVar24);
  auVar45 = vpmaxsd_avx2(auVar28,auVar34);
  auVar34 = vpminsd_avx2(auVar45,auVar24);
  auVar45 = vpaddd_avx2(auVar34,auVar41);
  auVar17 = vpsubd_avx2(auVar41,auVar34);
  auVar34 = vpsrad_avx2(auVar44,auVar20);
  auVar44 = vpsrad_avx2(auVar43,auVar20);
  auVar41 = vpaddd_avx2(auVar44,auVar34);
  auVar18 = vpsubd_avx2(auVar34,auVar44);
  auVar44 = vpsrad_avx2(auVar37,auVar20);
  auVar43 = vpsrad_avx2(auVar31,auVar20);
  auVar34 = vpaddd_avx2(auVar43,auVar44);
  auVar30 = vpsubd_avx2(auVar44,auVar43);
  auVar22 = vpmaxsd_avx2(auVar28,auVar22);
  auVar44 = vpminsd_avx2(auVar22,auVar24);
  auVar22 = vpmaxsd_avx2(auVar28,auVar27);
  auVar27 = vpminsd_avx2(auVar22,auVar24);
  auVar22 = vpaddd_avx2(auVar27,auVar44);
  auVar42 = vpsubd_avx2(auVar44,auVar27);
  auVar29 = vpmaxsd_avx2(auVar28,auVar29);
  auVar27 = vpminsd_avx2(auVar29,auVar24);
  auVar29 = vpmaxsd_avx2(auVar28,auVar23);
  auVar23 = vpminsd_avx2(auVar29,auVar24);
  auVar29 = vpaddd_avx2(auVar23,auVar27);
  auVar31 = vpsubd_avx2(auVar27,auVar23);
  auVar23 = vpsrad_avx2(auVar38,auVar20);
  auVar44 = vpsrad_avx2(auVar48,auVar20);
  auVar27 = vpaddd_avx2(auVar44,auVar23);
  auVar35 = vpsubd_avx2(auVar23,auVar44);
  auVar20 = ZEXT416((uint)bit);
  auVar44 = vpsrad_avx2(auVar25,auVar20);
  auVar43 = vpsrad_avx2(auVar21,auVar20);
  auVar23 = vpaddd_avx2(auVar44,auVar43);
  auVar25 = vpsubd_avx2(auVar44,auVar43);
  auVar47 = vpmaxsd_avx2(auVar47,auVar28);
  auVar44 = vpmaxsd_avx2(auVar33,auVar28);
  auVar45 = vpmaxsd_avx2(auVar45,auVar28);
  auVar43 = vpmaxsd_avx2(auVar17,auVar28);
  auVar41 = vpmaxsd_avx2(auVar41,auVar28);
  auVar38 = vpmaxsd_avx2(auVar28,auVar18);
  auVar34 = vpmaxsd_avx2(auVar28,auVar34);
  auVar48 = vpmaxsd_avx2(auVar28,auVar30);
  auVar22 = vpmaxsd_avx2(auVar28,auVar22);
  auVar33 = vpmaxsd_avx2(auVar28,auVar42);
  auVar29 = vpmaxsd_avx2(auVar28,auVar29);
  auVar21 = vpmaxsd_avx2(auVar28,auVar31);
  auVar27 = vpmaxsd_avx2(auVar28,auVar27);
  auVar17 = vpmaxsd_avx2(auVar28,auVar35);
  auVar23 = vpmaxsd_avx2(auVar23,auVar28);
  auVar18 = vpmaxsd_avx2(auVar28,auVar25);
  alVar3 = (__m256i)vpminsd_avx2(auVar47,auVar24);
  auVar47 = vpminsd_avx2(auVar44,auVar24);
  auVar44 = vpminsd_avx2(auVar45,auVar24);
  auVar45 = vpminsd_avx2(auVar43,auVar24);
  auVar43 = vpminsd_avx2(auVar41,auVar24);
  auVar41 = vpminsd_avx2(auVar38,auVar24);
  auVar38 = vpminsd_avx2(auVar34,auVar24);
  auVar34 = vpminsd_avx2(auVar48,auVar24);
  auVar48 = vpminsd_avx2(auVar22,auVar24);
  auVar22 = vpminsd_avx2(auVar33,auVar24);
  auVar29 = vpminsd_avx2(auVar24,auVar29);
  auVar33 = vpminsd_avx2(auVar24,auVar21);
  alVar4 = (__m256i)vpminsd_avx2(auVar24,auVar27);
  auVar27 = vpminsd_avx2(auVar24,auVar17);
  auVar23 = vpminsd_avx2(auVar23,auVar24);
  auVar21 = vpminsd_avx2(auVar18,auVar24);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar11 + 0x1e0);
  auVar25._4_4_ = uVar1;
  auVar25._0_4_ = uVar1;
  auVar25._8_4_ = uVar1;
  auVar25._12_4_ = uVar1;
  auVar25._16_4_ = uVar1;
  auVar25._20_4_ = uVar1;
  auVar25._24_4_ = uVar1;
  auVar25._28_4_ = uVar1;
  auVar47 = vpmulld_avx2(auVar47,auVar25);
  auVar17 = vpmulld_avx2(auVar45,auVar25);
  auVar47 = vpaddd_avx2(auVar49,auVar47);
  auVar45 = vpaddd_avx2(auVar47,auVar17);
  auVar17 = vpsubd_avx2(auVar47,auVar17);
  auVar47 = vpmulld_avx2(auVar41,auVar25);
  auVar34 = vpmulld_avx2(auVar34,auVar25);
  auVar47 = vpaddd_avx2(auVar49,auVar47);
  auVar41 = vpaddd_avx2(auVar34,auVar47);
  auVar18 = vpsubd_avx2(auVar47,auVar34);
  auVar47 = vpmulld_avx2(auVar22,auVar25);
  auVar22 = vpmulld_avx2(auVar33,auVar25);
  auVar47 = vpaddd_avx2(auVar47,auVar49);
  auVar34 = vpaddd_avx2(auVar47,auVar22);
  auVar33 = vpsubd_avx2(auVar47,auVar22);
  auVar47 = vpmulld_avx2(auVar27,auVar25);
  auVar27 = vpmulld_avx2(auVar21,auVar25);
  auVar47 = vpaddd_avx2(auVar47,auVar49);
  auVar22 = vpaddd_avx2(auVar47,auVar27);
  auVar27 = vpsubd_avx2(auVar47,auVar27);
  auVar47 = vpsrad_avx2(auVar45,auVar20);
  alVar5 = (__m256i)vpsrad_avx2(auVar17,auVar20);
  alVar6 = (__m256i)vpsrad_avx2(auVar41,auVar20);
  auVar45 = vpsrad_avx2(auVar18,auVar20);
  alVar7 = (__m256i)vpsrad_avx2(auVar34,auVar20);
  auVar41 = vpsrad_avx2(auVar33,auVar20);
  auVar34 = vpsrad_avx2(auVar22,auVar20);
  alVar8 = (__m256i)vpsrad_avx2(auVar27,auVar20);
  if (do_cols == 0) {
    iVar12 = 10;
    if (10 < bd) {
      iVar12 = bd;
    }
    iVar12 = 0x20 << ((byte)iVar12 & 0x1f);
    iVar10 = -iVar12;
    auVar26._4_4_ = iVar10;
    auVar26._0_4_ = iVar10;
    auVar26._8_4_ = iVar10;
    auVar26._12_4_ = iVar10;
    auVar26._16_4_ = iVar10;
    auVar26._20_4_ = iVar10;
    auVar26._24_4_ = iVar10;
    auVar26._28_4_ = iVar10;
    iVar12 = iVar12 + -1;
    auVar36._4_4_ = iVar12;
    auVar36._0_4_ = iVar12;
    auVar36._8_4_ = iVar12;
    auVar36._12_4_ = iVar12;
    auVar36._16_4_ = iVar12;
    auVar36._20_4_ = iVar12;
    auVar36._24_4_ = iVar12;
    auVar36._28_4_ = iVar12;
    iVar12 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar46._4_4_ = iVar12;
    auVar46._0_4_ = iVar12;
    auVar46._8_4_ = iVar12;
    auVar46._12_4_ = iVar12;
    auVar46._16_4_ = iVar12;
    auVar46._20_4_ = iVar12;
    auVar46._24_4_ = iVar12;
    auVar46._28_4_ = iVar12;
    auVar22 = vpaddd_avx2((undefined1  [32])alVar3,auVar46);
    auVar27 = vpsubd_avx2(auVar46,auVar48);
    auVar22 = vpsrad_avx2(auVar22,ZEXT416((uint)out_shift));
    auVar27 = vpsrad_avx2(auVar27,ZEXT416((uint)out_shift));
    auVar22 = vpmaxsd_avx2(auVar22,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar22,auVar36);
    *out = alVar3;
    auVar22 = vpmaxsd_avx2(auVar27,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar22,auVar36);
    out[1] = alVar3;
    auVar22 = vpaddd_avx2((undefined1  [32])alVar4,auVar46);
    auVar27 = vpsubd_avx2(auVar46,auVar43);
    auVar20 = ZEXT416((uint)out_shift);
    auVar22 = vpsrad_avx2(auVar22,auVar20);
    auVar27 = vpsrad_avx2(auVar27,auVar20);
    auVar22 = vpmaxsd_avx2(auVar22,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar22,auVar36);
    out[2] = alVar3;
    auVar22 = vpmaxsd_avx2(auVar27,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar22,auVar36);
    out[3] = alVar3;
    auVar22 = vpaddd_avx2(auVar46,(undefined1  [32])alVar6);
    auVar27 = vpsubd_avx2(auVar46,auVar34);
    auVar34 = vpsrad_avx2(auVar22,auVar20);
    auVar22 = vpsrad_avx2(auVar27,auVar20);
    auVar34 = vpmaxsd_avx2(auVar34,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar34,auVar36);
    out[4] = alVar3;
    auVar34 = vpmaxsd_avx2(auVar22,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar34,auVar36);
    out[5] = alVar3;
    auVar34 = vpaddd_avx2((undefined1  [32])alVar7,auVar46);
    auVar22 = vpsubd_avx2(auVar46,auVar47);
    auVar20 = ZEXT416((uint)out_shift);
    auVar47 = vpsrad_avx2(auVar34,auVar20);
    auVar34 = vpsrad_avx2(auVar22,auVar20);
    auVar47 = vpmaxsd_avx2(auVar47,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar47,auVar36);
    out[6] = alVar3;
    auVar47 = vpmaxsd_avx2(auVar34,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar47,auVar36);
    out[7] = alVar3;
    auVar47 = vpaddd_avx2((undefined1  [32])alVar5,auVar46);
    auVar41 = vpsubd_avx2(auVar46,auVar41);
    auVar47 = vpsrad_avx2(auVar47,auVar20);
    auVar41 = vpsrad_avx2(auVar41,auVar20);
    auVar47 = vpmaxsd_avx2(auVar47,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar47,auVar36);
    out[8] = alVar3;
    auVar47 = vpmaxsd_avx2(auVar41,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar47,auVar36);
    out[9] = alVar3;
    auVar47 = vpaddd_avx2(auVar46,(undefined1  [32])alVar8);
    auVar45 = vpsubd_avx2(auVar46,auVar45);
    auVar47 = vpsrad_avx2(auVar47,auVar20);
    auVar45 = vpsrad_avx2(auVar45,auVar20);
    auVar47 = vpmaxsd_avx2(auVar47,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar47,auVar36);
    out[10] = alVar3;
    auVar47 = vpmaxsd_avx2(auVar45,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar47,auVar36);
    out[0xb] = alVar3;
    auVar47 = vpaddd_avx2(auVar46,auVar38);
    auVar45 = vpsubd_avx2(auVar46,auVar23);
    auVar47 = vpsrad_avx2(auVar47,auVar20);
    auVar45 = vpsrad_avx2(auVar45,auVar20);
    auVar47 = vpmaxsd_avx2(auVar47,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar47,auVar36);
    out[0xc] = alVar3;
    auVar47 = vpmaxsd_avx2(auVar45,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar47,auVar36);
    out[0xd] = alVar3;
    auVar47 = vpaddd_avx2(auVar46,auVar29);
    auVar45 = vpsubd_avx2(auVar46,auVar44);
    auVar47 = vpsrad_avx2(auVar47,ZEXT416((uint)out_shift));
    auVar45 = vpsrad_avx2(auVar45,ZEXT416((uint)out_shift));
    auVar47 = vpmaxsd_avx2(auVar47,auVar26);
    auVar45 = vpmaxsd_avx2(auVar45,auVar26);
    alVar3 = (__m256i)vpminsd_avx2(auVar47,auVar36);
    alVar4 = (__m256i)vpminsd_avx2(auVar45,auVar36);
    out[0xe] = alVar3;
    out[0xf] = alVar4;
  }
  else {
    *out = alVar3;
    auVar22 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar3 = (__m256i)vpsubd_avx2(auVar22,auVar48);
    out[1] = alVar3;
    out[2] = alVar4;
    alVar3 = (__m256i)vpsubd_avx2(auVar22,auVar43);
    out[3] = alVar3;
    out[4] = alVar6;
    alVar3 = (__m256i)vpsubd_avx2(auVar22,auVar34);
    out[5] = alVar3;
    out[6] = alVar7;
    alVar3 = (__m256i)vpsubd_avx2(auVar22,auVar47);
    out[7] = alVar3;
    out[8] = alVar5;
    alVar3 = (__m256i)vpsubd_avx2(auVar22,auVar41);
    out[9] = alVar3;
    out[10] = alVar8;
    alVar3 = (__m256i)vpsubd_avx2(auVar22,auVar45);
    out[0xb] = alVar3;
    local_f8 = auVar38._0_8_;
    lStack_f0 = auVar38._8_8_;
    lStack_e8 = auVar38._16_8_;
    lStack_e0 = auVar38._24_8_;
    out[0xc][0] = local_f8;
    out[0xc][1] = lStack_f0;
    out[0xc][2] = lStack_e8;
    out[0xc][3] = lStack_e0;
    alVar3 = (__m256i)vpsubd_avx2(auVar22,auVar23);
    out[0xd] = alVar3;
    local_178 = auVar29._0_8_;
    lStack_170 = auVar29._8_8_;
    lStack_168 = auVar29._16_8_;
    lStack_160 = auVar29._24_8_;
    out[0xe][0] = local_178;
    out[0xe][1] = lStack_170;
    out[0xe][2] = lStack_168;
    out[0xe][3] = lStack_160;
    alVar3 = (__m256i)vpsubd_avx2(auVar22,auVar44);
    out[0xf] = alVar3;
  }
  return;
}

Assistant:

static void iadst16_low8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi10 = _mm256_set1_epi32(cospi[10]);
  const __m256i cospi54 = _mm256_set1_epi32(cospi[54]);
  const __m256i cospi18 = _mm256_set1_epi32(cospi[18]);
  const __m256i cospi46 = _mm256_set1_epi32(cospi[46]);
  const __m256i cospi26 = _mm256_set1_epi32(cospi[26]);
  const __m256i cospi38 = _mm256_set1_epi32(cospi[38]);
  const __m256i cospi34 = _mm256_set1_epi32(cospi[34]);
  const __m256i cospi30 = _mm256_set1_epi32(cospi[30]);
  const __m256i cospi42 = _mm256_set1_epi32(cospi[42]);
  const __m256i cospi22 = _mm256_set1_epi32(cospi[22]);
  const __m256i cospi50 = _mm256_set1_epi32(cospi[50]);
  const __m256i cospi14 = _mm256_set1_epi32(cospi[14]);
  const __m256i cospi58 = _mm256_set1_epi32(cospi[58]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i u[16], x, y;

  {
    // stage 0
    // stage 1
    // stage 2
    __m256i zero = _mm256_setzero_si256();
    x = _mm256_mullo_epi32(in[0], cospi62);
    u[0] = _mm256_add_epi32(x, rnding);
    u[0] = _mm256_srai_epi32(u[0], bit);

    x = _mm256_mullo_epi32(in[0], cospi2);
    u[1] = _mm256_sub_epi32(zero, x);
    u[1] = _mm256_add_epi32(u[1], rnding);
    u[1] = _mm256_srai_epi32(u[1], bit);

    x = _mm256_mullo_epi32(in[2], cospi54);
    u[2] = _mm256_add_epi32(x, rnding);
    u[2] = _mm256_srai_epi32(u[2], bit);

    x = _mm256_mullo_epi32(in[2], cospi10);
    u[3] = _mm256_sub_epi32(zero, x);
    u[3] = _mm256_add_epi32(u[3], rnding);
    u[3] = _mm256_srai_epi32(u[3], bit);

    x = _mm256_mullo_epi32(in[4], cospi46);
    u[4] = _mm256_add_epi32(x, rnding);
    u[4] = _mm256_srai_epi32(u[4], bit);

    x = _mm256_mullo_epi32(in[4], cospi18);
    u[5] = _mm256_sub_epi32(zero, x);
    u[5] = _mm256_add_epi32(u[5], rnding);
    u[5] = _mm256_srai_epi32(u[5], bit);

    x = _mm256_mullo_epi32(in[6], cospi38);
    u[6] = _mm256_add_epi32(x, rnding);
    u[6] = _mm256_srai_epi32(u[6], bit);

    x = _mm256_mullo_epi32(in[6], cospi26);
    u[7] = _mm256_sub_epi32(zero, x);
    u[7] = _mm256_add_epi32(u[7], rnding);
    u[7] = _mm256_srai_epi32(u[7], bit);

    u[8] = _mm256_mullo_epi32(in[7], cospi34);
    u[8] = _mm256_add_epi32(u[8], rnding);
    u[8] = _mm256_srai_epi32(u[8], bit);

    u[9] = _mm256_mullo_epi32(in[7], cospi30);
    u[9] = _mm256_add_epi32(u[9], rnding);
    u[9] = _mm256_srai_epi32(u[9], bit);

    u[10] = _mm256_mullo_epi32(in[5], cospi42);
    u[10] = _mm256_add_epi32(u[10], rnding);
    u[10] = _mm256_srai_epi32(u[10], bit);

    u[11] = _mm256_mullo_epi32(in[5], cospi22);
    u[11] = _mm256_add_epi32(u[11], rnding);
    u[11] = _mm256_srai_epi32(u[11], bit);

    u[12] = _mm256_mullo_epi32(in[3], cospi50);
    u[12] = _mm256_add_epi32(u[12], rnding);
    u[12] = _mm256_srai_epi32(u[12], bit);

    u[13] = _mm256_mullo_epi32(in[3], cospi14);
    u[13] = _mm256_add_epi32(u[13], rnding);
    u[13] = _mm256_srai_epi32(u[13], bit);

    u[14] = _mm256_mullo_epi32(in[1], cospi58);
    u[14] = _mm256_add_epi32(u[14], rnding);
    u[14] = _mm256_srai_epi32(u[14], bit);

    u[15] = _mm256_mullo_epi32(in[1], cospi6);
    u[15] = _mm256_add_epi32(u[15], rnding);
    u[15] = _mm256_srai_epi32(u[15], bit);

    // stage 3
    addsub_avx2(u[0], u[8], &u[0], &u[8], &clamp_lo, &clamp_hi);
    addsub_avx2(u[1], u[9], &u[1], &u[9], &clamp_lo, &clamp_hi);
    addsub_avx2(u[2], u[10], &u[2], &u[10], &clamp_lo, &clamp_hi);
    addsub_avx2(u[3], u[11], &u[3], &u[11], &clamp_lo, &clamp_hi);
    addsub_avx2(u[4], u[12], &u[4], &u[12], &clamp_lo, &clamp_hi);
    addsub_avx2(u[5], u[13], &u[5], &u[13], &clamp_lo, &clamp_hi);
    addsub_avx2(u[6], u[14], &u[6], &u[14], &clamp_lo, &clamp_hi);
    addsub_avx2(u[7], u[15], &u[7], &u[15], &clamp_lo, &clamp_hi);

    // stage 4
    y = _mm256_mullo_epi32(u[8], cospi56);
    x = _mm256_mullo_epi32(u[9], cospi56);
    u[8] = _mm256_mullo_epi32(u[8], cospi8);
    u[8] = _mm256_add_epi32(u[8], x);
    u[8] = _mm256_add_epi32(u[8], rnding);
    u[8] = _mm256_srai_epi32(u[8], bit);

    x = _mm256_mullo_epi32(u[9], cospi8);
    u[9] = _mm256_sub_epi32(y, x);
    u[9] = _mm256_add_epi32(u[9], rnding);
    u[9] = _mm256_srai_epi32(u[9], bit);

    x = _mm256_mullo_epi32(u[11], cospi24);
    y = _mm256_mullo_epi32(u[10], cospi24);
    u[10] = _mm256_mullo_epi32(u[10], cospi40);
    u[10] = _mm256_add_epi32(u[10], x);
    u[10] = _mm256_add_epi32(u[10], rnding);
    u[10] = _mm256_srai_epi32(u[10], bit);

    x = _mm256_mullo_epi32(u[11], cospi40);
    u[11] = _mm256_sub_epi32(y, x);
    u[11] = _mm256_add_epi32(u[11], rnding);
    u[11] = _mm256_srai_epi32(u[11], bit);

    x = _mm256_mullo_epi32(u[13], cospi8);
    y = _mm256_mullo_epi32(u[12], cospi8);
    u[12] = _mm256_mullo_epi32(u[12], cospim56);
    u[12] = _mm256_add_epi32(u[12], x);
    u[12] = _mm256_add_epi32(u[12], rnding);
    u[12] = _mm256_srai_epi32(u[12], bit);

    x = _mm256_mullo_epi32(u[13], cospim56);
    u[13] = _mm256_sub_epi32(y, x);
    u[13] = _mm256_add_epi32(u[13], rnding);
    u[13] = _mm256_srai_epi32(u[13], bit);

    x = _mm256_mullo_epi32(u[15], cospi40);
    y = _mm256_mullo_epi32(u[14], cospi40);
    u[14] = _mm256_mullo_epi32(u[14], cospim24);
    u[14] = _mm256_add_epi32(u[14], x);
    u[14] = _mm256_add_epi32(u[14], rnding);
    u[14] = _mm256_srai_epi32(u[14], bit);

    x = _mm256_mullo_epi32(u[15], cospim24);
    u[15] = _mm256_sub_epi32(y, x);
    u[15] = _mm256_add_epi32(u[15], rnding);
    u[15] = _mm256_srai_epi32(u[15], bit);

    // stage 5
    addsub_avx2(u[0], u[4], &u[0], &u[4], &clamp_lo, &clamp_hi);
    addsub_avx2(u[1], u[5], &u[1], &u[5], &clamp_lo, &clamp_hi);
    addsub_avx2(u[2], u[6], &u[2], &u[6], &clamp_lo, &clamp_hi);
    addsub_avx2(u[3], u[7], &u[3], &u[7], &clamp_lo, &clamp_hi);
    addsub_avx2(u[8], u[12], &u[8], &u[12], &clamp_lo, &clamp_hi);
    addsub_avx2(u[9], u[13], &u[9], &u[13], &clamp_lo, &clamp_hi);
    addsub_avx2(u[10], u[14], &u[10], &u[14], &clamp_lo, &clamp_hi);
    addsub_avx2(u[11], u[15], &u[11], &u[15], &clamp_lo, &clamp_hi);

    // stage 6
    x = _mm256_mullo_epi32(u[5], cospi48);
    y = _mm256_mullo_epi32(u[4], cospi48);
    u[4] = _mm256_mullo_epi32(u[4], cospi16);
    u[4] = _mm256_add_epi32(u[4], x);
    u[4] = _mm256_add_epi32(u[4], rnding);
    u[4] = _mm256_srai_epi32(u[4], bit);

    x = _mm256_mullo_epi32(u[5], cospi16);
    u[5] = _mm256_sub_epi32(y, x);
    u[5] = _mm256_add_epi32(u[5], rnding);
    u[5] = _mm256_srai_epi32(u[5], bit);

    x = _mm256_mullo_epi32(u[7], cospi16);
    y = _mm256_mullo_epi32(u[6], cospi16);
    u[6] = _mm256_mullo_epi32(u[6], cospim48);
    u[6] = _mm256_add_epi32(u[6], x);
    u[6] = _mm256_add_epi32(u[6], rnding);
    u[6] = _mm256_srai_epi32(u[6], bit);

    x = _mm256_mullo_epi32(u[7], cospim48);
    u[7] = _mm256_sub_epi32(y, x);
    u[7] = _mm256_add_epi32(u[7], rnding);
    u[7] = _mm256_srai_epi32(u[7], bit);

    x = _mm256_mullo_epi32(u[13], cospi48);
    y = _mm256_mullo_epi32(u[12], cospi48);
    u[12] = _mm256_mullo_epi32(u[12], cospi16);
    u[12] = _mm256_add_epi32(u[12], x);
    u[12] = _mm256_add_epi32(u[12], rnding);
    u[12] = _mm256_srai_epi32(u[12], bit);

    x = _mm256_mullo_epi32(u[13], cospi16);
    u[13] = _mm256_sub_epi32(y, x);
    u[13] = _mm256_add_epi32(u[13], rnding);
    u[13] = _mm256_srai_epi32(u[13], bit);

    x = _mm256_mullo_epi32(u[15], cospi16);
    y = _mm256_mullo_epi32(u[14], cospi16);
    u[14] = _mm256_mullo_epi32(u[14], cospim48);
    u[14] = _mm256_add_epi32(u[14], x);
    u[14] = _mm256_add_epi32(u[14], rnding);
    u[14] = _mm256_srai_epi32(u[14], bit);

    x = _mm256_mullo_epi32(u[15], cospim48);
    u[15] = _mm256_sub_epi32(y, x);
    u[15] = _mm256_add_epi32(u[15], rnding);
    u[15] = _mm256_srai_epi32(u[15], bit);

    // stage 7
    addsub_avx2(u[0], u[2], &u[0], &u[2], &clamp_lo, &clamp_hi);
    addsub_avx2(u[1], u[3], &u[1], &u[3], &clamp_lo, &clamp_hi);
    addsub_avx2(u[4], u[6], &u[4], &u[6], &clamp_lo, &clamp_hi);
    addsub_avx2(u[5], u[7], &u[5], &u[7], &clamp_lo, &clamp_hi);
    addsub_avx2(u[8], u[10], &u[8], &u[10], &clamp_lo, &clamp_hi);
    addsub_avx2(u[9], u[11], &u[9], &u[11], &clamp_lo, &clamp_hi);
    addsub_avx2(u[12], u[14], &u[12], &u[14], &clamp_lo, &clamp_hi);
    addsub_avx2(u[13], u[15], &u[13], &u[15], &clamp_lo, &clamp_hi);

    // stage 8
    y = _mm256_mullo_epi32(u[2], cospi32);
    x = _mm256_mullo_epi32(u[3], cospi32);
    u[2] = _mm256_add_epi32(y, x);
    u[2] = _mm256_add_epi32(u[2], rnding);
    u[2] = _mm256_srai_epi32(u[2], bit);

    u[3] = _mm256_sub_epi32(y, x);
    u[3] = _mm256_add_epi32(u[3], rnding);
    u[3] = _mm256_srai_epi32(u[3], bit);
    y = _mm256_mullo_epi32(u[6], cospi32);
    x = _mm256_mullo_epi32(u[7], cospi32);
    u[6] = _mm256_add_epi32(y, x);
    u[6] = _mm256_add_epi32(u[6], rnding);
    u[6] = _mm256_srai_epi32(u[6], bit);

    u[7] = _mm256_sub_epi32(y, x);
    u[7] = _mm256_add_epi32(u[7], rnding);
    u[7] = _mm256_srai_epi32(u[7], bit);

    y = _mm256_mullo_epi32(u[10], cospi32);
    x = _mm256_mullo_epi32(u[11], cospi32);
    u[10] = _mm256_add_epi32(y, x);
    u[10] = _mm256_add_epi32(u[10], rnding);
    u[10] = _mm256_srai_epi32(u[10], bit);

    u[11] = _mm256_sub_epi32(y, x);
    u[11] = _mm256_add_epi32(u[11], rnding);
    u[11] = _mm256_srai_epi32(u[11], bit);

    y = _mm256_mullo_epi32(u[14], cospi32);
    x = _mm256_mullo_epi32(u[15], cospi32);
    u[14] = _mm256_add_epi32(y, x);
    u[14] = _mm256_add_epi32(u[14], rnding);
    u[14] = _mm256_srai_epi32(u[14], bit);

    u[15] = _mm256_sub_epi32(y, x);
    u[15] = _mm256_add_epi32(u[15], rnding);
    u[15] = _mm256_srai_epi32(u[15], bit);

    // stage 9
    if (do_cols) {
      out[0] = u[0];
      out[1] = _mm256_sub_epi32(_mm256_setzero_si256(), u[8]);
      out[2] = u[12];
      out[3] = _mm256_sub_epi32(_mm256_setzero_si256(), u[4]);
      out[4] = u[6];
      out[5] = _mm256_sub_epi32(_mm256_setzero_si256(), u[14]);
      out[6] = u[10];
      out[7] = _mm256_sub_epi32(_mm256_setzero_si256(), u[2]);
      out[8] = u[3];
      out[9] = _mm256_sub_epi32(_mm256_setzero_si256(), u[11]);
      out[10] = u[15];
      out[11] = _mm256_sub_epi32(_mm256_setzero_si256(), u[7]);
      out[12] = u[5];
      out[13] = _mm256_sub_epi32(_mm256_setzero_si256(), u[13]);
      out[14] = u[9];
      out[15] = _mm256_sub_epi32(_mm256_setzero_si256(), u[1]);
    } else {
      const int log_range_out = AOMMAX(16, bd + 6);
      const __m256i clamp_lo_out =
          _mm256_set1_epi32(-(1 << (log_range_out - 1)));
      const __m256i clamp_hi_out =
          _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

      neg_shift_avx2(u[0], u[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
      neg_shift_avx2(u[12], u[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(u[6], u[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(u[10], u[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(u[3], u[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(u[15], u[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(u[5], u[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
      neg_shift_avx2(u[9], u[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    }
  }
}